

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

vm_obj_id_t CVmObjWeakRefLookupTable::create(int in_root_set,uint bucket_count,uint init_capacity)

{
  vm_obj_id_t obj_id;
  CVmObjWeakRefLookupTable *this;
  
  obj_id = vm_new_id(in_root_set,1,1);
  this = (CVmObjWeakRefLookupTable *)CVmObject::operator_new(0x10,obj_id);
  CVmObjWeakRefLookupTable(this,(ulong)bucket_count,(ulong)init_capacity);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjWeakRefLookupTable::
   create(VMG_ int in_root_set, uint bucket_count, uint init_capacity)
{
    vm_obj_id_t id;

    /* allocate the object ID */
    id = vm_new_id(vmg_ in_root_set, TRUE, TRUE);

    /* create the object */
    new (vmg_ id) CVmObjWeakRefLookupTable(vmg_ bucket_count, init_capacity);

    /* return the new ID */
    return id;
}